

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_timer.cpp
# Opt level: O0

void __thiscall lzham::lzham_timer::lzham_timer(lzham_timer *this,timer_ticks start_ticks)

{
  undefined8 in_RSI;
  EVP_PKEY_CTX *in_RDI;
  
  if ((g_inv_freq == 0.0) && (!NAN(g_inv_freq))) {
    init(in_RDI);
  }
  *(undefined8 *)in_RDI = in_RSI;
  in_RDI[0x10] = (EVP_PKEY_CTX)((byte)in_RDI[0x10] & 0xfe | 1);
  in_RDI[0x10] = (EVP_PKEY_CTX)((byte)in_RDI[0x10] & 0xfd);
  return;
}

Assistant:

lzham_timer::lzham_timer(timer_ticks start_ticks)
   {
      if (!g_inv_freq) 
         init();
      
      m_start_time = start_ticks;
      
      m_started = true;
      m_stopped = false;
   }